

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O2

matrix_type * __thiscall
Disa::Matrix_Dense<double,2ul,2ul>::operator+=
          (Matrix_Dense<double,2ul,2ul> *this,Matrix_Dense<double,_2UL,_2UL> *matrix)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 0x10) {
    Vector_Dense<double,2ul>::operator+=
              ((Vector_Dense<double,2ul> *)(this + lVar1),
               (Vector_Dense<double,_2UL> *)
               ((long)(matrix->super_array<Disa::Vector_Dense<double,_2UL>,_2UL>)._M_elems[0].
                      super_array<double,_2UL>._M_elems + lVar1));
  }
  return (matrix_type *)this;
}

Assistant:

constexpr matrix_type& operator+=(const Matrix_Dense<_type, _row_other, _col_other>& matrix) {
    ASSERT_DEBUG(size() == matrix.size(), "Incompatible matrix dimensions, " + std::to_string(size_row()) + "," +
                                          std::to_string(size_column()) + " vs. " + std::to_string(matrix.size_row()) +
                                          "," + std::to_string(matrix.size_column()) + ".");
    FOR(row, _row)(*this)[row] += matrix[row];
    return *this;
  }